

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O0

void __thiscall oout::TimedTest::TimedTest(TimedTest *this,shared_ptr<const_oout::Test> *test)

{
  shared_ptr<const_oout::Test> *test_local;
  TimedTest *this_local;
  
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TimedTest_001686a0;
  std::shared_ptr<const_oout::Test>::shared_ptr(&this->test,test);
  return;
}

Assistant:

TimedTest::TimedTest(const shared_ptr<const Test> &test)
	: test(test)
{
}